

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDirWrapper.cpp
# Opt level: O0

bool __thiscall DebugDirWrapper::isRepro(DebugDirWrapper *this)

{
  bool bVar1;
  reference ppEVar2;
  uint64_t uVar3;
  ExeElementWrapper *local_58;
  uint64_t typeVal;
  ExeElementWrapper *pEStack_30;
  bool isOk;
  DebugDirEntryWrapper *dbgEntry;
  __normal_iterator<ExeNodeWrapper_**,_std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>_>
  local_20;
  iterator itr;
  DebugDirWrapper *this_local;
  
  itr._M_current = (ExeNodeWrapper **)this;
  local_20._M_current =
       (ExeNodeWrapper **)
       std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>::begin
                 (&(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                   entries);
  do {
    dbgEntry = (DebugDirEntryWrapper *)
               std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>::end
                         (&(this->super_DataDirEntryWrapper).super_PENodeWrapper.
                           super_ExeNodeWrapper.entries);
    bVar1 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<ExeNodeWrapper_**,_std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>_>
                        *)&dbgEntry);
    if (!bVar1) {
      return false;
    }
    ppEVar2 = __gnu_cxx::
              __normal_iterator<ExeNodeWrapper_**,_std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>_>
              ::operator*(&local_20);
    if (*ppEVar2 == (ExeNodeWrapper *)0x0) {
      local_58 = (ExeElementWrapper *)0x0;
    }
    else {
      local_58 = (ExeElementWrapper *)
                 __dynamic_cast(*ppEVar2,&ExeNodeWrapper::typeinfo,&DebugDirEntryWrapper::typeinfo,0
                               );
    }
    pEStack_30 = local_58;
    if (local_58 != (ExeElementWrapper *)0x0) {
      typeVal._7_1_ = 0;
      uVar3 = ExeElementWrapper::getNumValue(local_58,4,(bool *)((long)&typeVal + 7));
      if (((typeVal._7_1_ & 1) != 0) && (uVar3 == 0x10)) {
        return true;
      }
    }
    __gnu_cxx::
    __normal_iterator<ExeNodeWrapper_**,_std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>_>
    ::operator++(&local_20);
  } while( true );
}

Assistant:

bool DebugDirWrapper::isRepro()
{
    for (auto itr = entries.begin(); itr != entries.end(); ++itr) {
        DebugDirEntryWrapper* dbgEntry = dynamic_cast<DebugDirEntryWrapper*>(*itr);
        if (!dbgEntry) continue;
        
        bool isOk = false;
        uint64_t typeVal = dbgEntry->getNumValue(DebugDirEntryWrapper::TYPE, &isOk);
        if (isOk && typeVal == pe::DT_REPRO) {
            return true;
        }
    }
    return false;
}